

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::computeFragmentReference
          (ShaderRenderCaseInstance *this,Surface *result,QuadGrid *quadGrid)

{
  int iVar1;
  int iVar2;
  Vec4 *v;
  int iVar3;
  int iVar4;
  int x;
  int iVar5;
  float fVar6;
  Vec4 color;
  ShaderEvalContext evalCtx;
  RGBA local_2c4;
  Vec4 *local_2c0;
  ShaderRenderCaseInstance *local_2b8;
  Vector<float,_4> local_2b0;
  ShaderEvalContext local_2a0;
  
  iVar1 = result->m_width;
  iVar3 = result->m_height;
  ShaderEvalContext::ShaderEvalContext(&local_2a0,quadGrid);
  fVar6 = (float)iVar3;
  iVar4 = 0;
  iVar2 = iVar1;
  if (iVar1 < 1) {
    iVar2 = 0;
  }
  local_2c0 = &this->m_clearColor;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  local_2b8 = this;
  for (; iVar4 != iVar3; iVar4 = iVar4 + 1) {
    for (iVar5 = 0; iVar2 != iVar5; iVar5 = iVar5 + 1) {
      ShaderEvalContext::reset
                (&local_2a0,((float)iVar5 + 0.5) / (float)iVar1,((float)iVar4 + 0.5) / fVar6);
      (*local_2b8->m_evaluator->_vptr_ShaderEvaluator[2])(local_2b8->m_evaluator,&local_2a0);
      v = &local_2a0.color;
      if (local_2a0.isDiscarded != false) {
        v = local_2c0;
      }
      tcu::Vector<float,_4>::Vector(&local_2b0,v);
      tcu::RGBA::RGBA(&local_2c4,&local_2b0);
      *(deUint32 *)((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar4 + iVar5) * 4) =
           local_2c4.m_value;
    }
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::computeFragmentReference (tcu::Surface& result, const QuadGrid& quadGrid)
{
	DE_ASSERT(m_evaluator);

	// Buffer info.
	const int			width		= result.getWidth();
	const int			height		= result.getHeight();
	const bool			hasAlpha	= true;  // \todo [2015-09-07 elecro] add correct alpha check
	ShaderEvalContext	evalCtx		(quadGrid);

	// Render.
	for (int y = 0; y < height; y++)
	for (int x = 0; x < width; x++)
	{
		const float sx = ((float)x + 0.5f) / (float)width;
		const float sy = ((float)y + 0.5f) / (float)height;

		evalCtx.reset(sx, sy);
		m_evaluator->evaluate(evalCtx);
		// Select either clear color or computed color based on discarded bit.
		tcu::Vec4 color = evalCtx.isDiscarded ? m_clearColor : evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		result.setPixel(x, y, tcu::RGBA(color));
	}
}